

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadGlobalHeader
          (BinaryReader *this,Type *out_type,bool *out_mutable)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  byte local_2d;
  Type local_2c;
  uint8_t mutable_;
  bool *pbStack_28;
  Type global_type;
  bool *out_mutable_local;
  Type *out_type_local;
  BinaryReader *this_local;
  
  pbStack_28 = out_mutable;
  Type::Type(&local_2c,Void);
  local_2d = 0;
  RVar2 = ReadType(this,&local_2c,"global type");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = IsConcreteType(this,local_2c);
    if (bVar1) {
      RVar2 = ReadU8(this,&local_2d,"global mutability");
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else if (local_2d < 2) {
        out_type->enum_ = (Enum)local_2c;
        *pbStack_28 = local_2d != 0;
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      else {
        PrintError(this,"global mutability must be 0 or 1");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      EVar3 = Type::operator_cast_to_Enum(&local_2c);
      PrintError(this,"invalid global type: %#x",(ulong)(uint)EVar3);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadGlobalHeader(Type* out_type, bool* out_mutable) {
  Type global_type = Type::Void;
  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadType(&global_type, "global type"));
  ERROR_UNLESS(IsConcreteType(global_type), "invalid global type: %#x",
               static_cast<int>(global_type));

  CHECK_RESULT(ReadU8(&mutable_, "global mutability"));
  ERROR_UNLESS(mutable_ <= 1, "global mutability must be 0 or 1");

  *out_type = global_type;
  *out_mutable = mutable_;
  return Result::Ok;
}